

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O1

void OCSBtest(double *x,int N,int f,int mlags,char *method,double *statistics,double *critical)

{
  size_t __size;
  double *pdVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  double *__ptr_00;
  reg_object prVar4;
  reg_object prVar5;
  void *__ptr_01;
  char *__s;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  uVar6 = (ulong)(uint)mlags;
  __ptr = malloc((long)mlags * 8);
  __ptr_00 = (double *)malloc((long)mlags * 8);
  if ((mlags < 1) || (iVar3 = strcmp(method,"fixed"), iVar3 == 0)) {
    prVar4 = (reg_object)0x0;
    iVar3 = mlags;
  }
  else {
    uVar7 = 1;
    do {
      prVar4 = fitOCSB(x,N,f,(int)uVar7,mlags);
      *(reg_object *)((long)__ptr + uVar7 * 8 + -8) = prVar4;
      iVar3 = strcmp(method,"aic");
      lVar8 = 0x98;
      if ((iVar3 != 0) && (iVar3 = strcmp(method,"AIC"), iVar3 != 0)) {
        iVar3 = strcmp(method,"bic");
        lVar8 = 0xa0;
        if ((iVar3 != 0) && (iVar3 = strcmp(method,"BIC"), iVar3 != 0)) {
          iVar3 = strcmp(method,"aicc");
          lVar8 = 0xa8;
          if ((iVar3 != 0) && (iVar3 = strcmp(method,"AICc"), iVar3 != 0)) {
            __s = "Only three criterions are accepted - aic, bic and aicc ";
            goto LAB_0014c7a8;
          }
        }
      }
      __ptr_00[uVar7 - 1] = *(double *)((long)prVar4->R2 + lVar8 + -0x38);
      uVar7 = uVar7 + 1;
    } while (mlags + 1 != uVar7);
    lVar8 = 0;
    do {
      pdVar1 = __ptr_00 + lVar8;
      if (!NAN(*pdVar1)) break;
      bVar9 = uVar6 - 1 != lVar8;
      lVar8 = lVar8 + 1;
    } while (bVar9);
    if (NAN(*pdVar1)) {
      __s = "All lag values up to \'maxlag\' produced singular matrices. Use different method. ";
      goto LAB_0014c7a8;
    }
    dVar10 = *__ptr_00;
    iVar3 = -(uint)NAN(dVar10);
    if (mlags != 1) {
      uVar7 = 1;
      dVar10 = (double)(~-(ulong)(!NAN(dVar10) && !NAN(dVar10)) & 0x7fefffffffffffff |
                       (ulong)dVar10 & -(ulong)(!NAN(dVar10) && !NAN(dVar10)));
      do {
        dVar11 = __ptr_00[uVar7];
        iVar2 = (int)uVar7;
        if (dVar10 <= dVar11) {
          dVar11 = dVar10;
          iVar2 = iVar3;
        }
        iVar3 = iVar2;
        uVar7 = uVar7 + 1;
        dVar10 = dVar11;
      } while (uVar6 != uVar7);
    }
    prVar4 = *(reg_object *)((long)__ptr + (long)iVar3 * 8);
    iVar3 = iVar3 + -1;
  }
  prVar5 = fitOCSB(x,N,f,iVar3,iVar3);
  if ((prVar5->rank == prVar5->p) || (prVar5 = prVar4, prVar4 != (reg_object)0x0)) {
    iVar3 = prVar5->p;
    __size = (long)iVar3 * 8;
    __ptr_01 = malloc(__size);
    if (0 < (long)iVar3) {
      lVar8 = 0;
      do {
        *(double *)((long)__ptr_01 + lVar8) =
             *(double *)((long)&prVar5->beta[0].value + lVar8 * 4) /
             *(double *)((long)&prVar5->beta[0].stdErr + lVar8 * 4);
        lVar8 = lVar8 + 8;
      } while (__size - lVar8 != 0);
    }
    if (0 < mlags) {
      uVar7 = 0;
      do {
        free_reg(*(reg_object *)((long)__ptr + uVar7 * 8));
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    dVar10 = log((double)f);
    dVar10 = dVar10 + -0.7656451;
    dVar10 = exp(dVar10 * -0.2850853 + dVar10 * dVar10 * -0.05983644);
    *critical = dVar10 * -0.2937411 + -1.652202;
    *statistics = *(double *)((long)__ptr_01 + (long)prVar5->p * 8 + -8);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    return;
  }
  __s = "Could not find a solution. Try a different method. ";
LAB_0014c7a8:
  puts(__s);
  exit(-1);
}

Assistant:

void OCSBtest(double *x, int N, int f, int mlags, const char *method,double *statistics,double *critical) {
    int i, bestindex,allnans,maxlag;
    double *tval,*icvals;
    reg_object fit;
    reg_object *list = (reg_object*)malloc(sizeof(reg_object)*mlags);
    reg_object crit_reg = NULL;

    icvals = (double*) malloc(sizeof(double)*mlags);

    maxlag = mlags;
    if (mlags > 0 && strcmp(method,"fixed")) {

        for(i = 1; i <= mlags;++i) {
            list[i-1] = fitOCSB(x,N,f,i,mlags);
            icvals[i-1] = getCVal(list[i-1],method);
            //printf("icvals %g",icvals[i-1]);
        }

        allnans = checkAllNans(icvals,mlags);

        if (allnans == 1) {
            printf("All lag values up to 'maxlag' produced singular matrices. Use different method. \n");
            exit(-1);
        }

        bestindex = getBestIndex(icvals,mlags);
        maxlag = bestindex-1;
        crit_reg = list[bestindex];

    }

    /* if (maxlag <= 0) {
        fit = crit_reg;
    } else {
        fit = fitOCSB(x,N,f,maxlag,maxlag);

        if (fit->rank != fit->p && fit->rank == fit->rank) {
            if (crit_reg == NULL) {
                printf("Could not find a solution. Try a different method. \n");
                exit(-1);
            } else {
                fit = crit_reg;
            }
        }
    } */

    fit = fitOCSB(x,N,f,maxlag,maxlag);

    //printf("\n\n%d\n\n",fit->rank);

    if (fit->rank != fit->p && fit->rank == fit->rank) {
        if (crit_reg == NULL) {
            printf("Could not find a solution. Try a different method. \n");
            exit(-1);
        } else {
            fit = crit_reg;
        }
    }

    tval = (double*) malloc(sizeof(double)*fit->p);

    for(i = 0; i < fit->p; ++i) {
		tval[i] = (fit->beta+i)->value/(fit->beta+i)->stdErr;
	}

    //mdisplay(tval,1,fit->p);

    for(i = 0; i < mlags;++i) {
		free_reg(list[i]);
    }

    *critical = calcOCSBCritVal(f);
    *statistics = tval[fit->p-1];

    free(list);
    free(icvals);
    free(tval);
}